

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O1

IntersectionData *
vera::intersection(IntersectionData *__return_storage_ptr__,Ray *_ray,Triangle *_triangle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  float t;
  float v;
  float u;
  float local_1c;
  float local_18;
  float local_14;
  
  __return_storage_ptr__->distance = 0.0;
  __return_storage_ptr__->hit = false;
  bVar5 = intersection(_ray,_triangle,&local_1c,&local_14,&local_18);
  __return_storage_ptr__->hit = bVar5;
  if (bVar5) {
    __return_storage_ptr__->distance = local_1c;
    fVar1 = *(float *)(_ray + 0x10);
    fVar2 = *(float *)(_ray + 0x14);
    fVar3 = *(float *)(_ray + 4);
    fVar4 = *(float *)(_ray + 8);
    (__return_storage_ptr__->position).field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
         (*(float *)(_ray + 0xc) * local_1c + *(float *)_ray);
    (__return_storage_ptr__->position).field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(fVar1 * local_1c + fVar3);
    (__return_storage_ptr__->position).field_2.z = local_1c * fVar2 + fVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

IntersectionData intersection(const Ray& _ray, const Triangle& _triangle) {

    IntersectionData idata;

    float t,u,v;
    idata.hit = intersection(_ray, _triangle, t, u, v);
    // idata.hit = intersectionMT(_ray, _triangle, t, u, v);

    if (!idata.hit) return idata;

    // float vn = glm::dot(_ray.getDirection(), _triangle.getNormal());
    // glm::vec3 aa = _ray.getOrigin() - _triangle[0];
    // float xpn = glm::dot(aa, _triangle.getNormal());
    // idata.distance = -xpn / vn;
    idata.distance = t;
    idata.position = _ray.getAt(t);
    return idata;

}